

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLExtras.h
# Opt level: O0

type __thiscall
llvm::make_unique<llbuild::buildsystem::Target,std::__cxx11::string&>
          (llvm *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  Target *this_00;
  string local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  
  local_18 = args;
  args_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  this_00 = (Target *)operator_new(0x38);
  std::__cxx11::string::string((string *)&local_38,(string *)local_18);
  llbuild::buildsystem::Target::Target(this_00,&local_38);
  std::unique_ptr<llbuild::buildsystem::Target,std::default_delete<llbuild::buildsystem::Target>>::
  unique_ptr<std::default_delete<llbuild::buildsystem::Target>,void>
            ((unique_ptr<llbuild::buildsystem::Target,std::default_delete<llbuild::buildsystem::Target>>
              *)this,this_00);
  std::__cxx11::string::~string((string *)&local_38);
  return (__uniq_ptr_data<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>,_true,_true>
          )(__uniq_ptr_data<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>,_true,_true>
            )this;
}

Assistant:

typename std::enable_if<!std::is_array<T>::value, std::unique_ptr<T>>::type
make_unique(Args &&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}